

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pp.cpp
# Opt level: O2

int __thiscall glslang::TPpContext::CPPinclude(TPpContext *this,TPpToken *ppToken)

{
  Includer *pIVar1;
  pointer pcVar2;
  char delimit;
  _Alloc_hider _Var3;
  int iVar4;
  int iVar5;
  uint uVar6;
  size_type sVar7;
  IncludeResult *includedFile;
  undefined4 extraout_var_00;
  ostream *poVar8;
  TokenizableIncludeFile *this_00;
  char *pcVar9;
  TParseContextBase *pTVar10;
  _func_int **pp_Var11;
  TSourceLoc directiveLoc;
  string filename;
  string local_360;
  string local_340;
  ostringstream prologue;
  undefined1 local_310 [360];
  ostringstream epilogue;
  undefined4 extraout_var;
  
  directiveLoc.column = (ppToken->loc).column;
  directiveLoc._20_4_ = *(undefined4 *)&(ppToken->loc).field_0x14;
  directiveLoc.name = (ppToken->loc).name;
  directiveLoc.string = (ppToken->loc).string;
  directiveLoc.line = (ppToken->loc).line;
  do {
    do {
      iVar4 = (*(this->inputStack).
                super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[3])();
    } while (iVar4 == 9);
  } while (iVar4 == 0x20);
  if (iVar4 == 0x3c) {
    delimit = '>';
LAB_0043308c:
    iVar5 = scanHeaderName(this,ppToken,delimit);
  }
  else {
    if (iVar4 == 0x22) {
      delimit = '\"';
      goto LAB_0043308c;
    }
    (*(this->inputStack).
      super__Vector_base<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
      ._M_impl.super__Vector_impl_data._M_finish[-1]->_vptr_tInput[4])();
    iVar5 = scanToken(this,ppToken);
  }
  if (iVar5 != 0xa1) {
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (this->parseContext,&directiveLoc,"must be followed by a header name","#include","");
    return iVar5;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filename,ppToken->name,(allocator<char> *)&prologue);
  iVar5 = scanToken(this,ppToken);
  _Var3 = filename._M_dataplus;
  if (iVar5 != 10) {
    if (iVar5 == -1) {
      pTVar10 = this->parseContext;
      pp_Var11 = (pTVar10->super_TParseVersions)._vptr_TParseVersions;
      pcVar9 = "expected newline after header name:";
    }
    else {
      pTVar10 = this->parseContext;
      pp_Var11 = (pTVar10->super_TParseVersions)._vptr_TParseVersions;
      pcVar9 = "extra content after header name:";
    }
    (*pp_Var11[0x2f])(pTVar10,ppToken,pcVar9,"#include","%s",filename._M_dataplus._M_p);
    goto LAB_004331b9;
  }
  if (iVar4 == 0x3c) {
LAB_004331d7:
    includedFile = (IncludeResult *)0x0;
LAB_004331da:
    (*this->includer->_vptr_Includer[2])(this->includer,includedFile);
    _Var3 = filename._M_dataplus;
    pIVar1 = this->includer;
    pcVar2 = (this->currentSourceFile)._M_dataplus._M_p;
    sVar7 = std::
            deque<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>
            ::size(&(this->includeStack).c);
    iVar4 = (**pIVar1->_vptr_Includer)(pIVar1,_Var3._M_p,pcVar2,sVar7 + 1);
    includedFile = (IncludeResult *)CONCAT44(extraout_var_00,iVar4);
    if (includedFile == (IncludeResult *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&prologue,"Could not process include directive",
                 (allocator<char> *)&epilogue);
    }
    else {
      if ((includedFile->headerName)._M_string_length != 0) goto LAB_00433233;
      _prologue = local_310;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&prologue,includedFile->headerData,
                 includedFile->headerData + includedFile->headerLength);
    }
    (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x2f])
              (this->parseContext,&directiveLoc,_prologue,"#include","for header name: %s",
               filename._M_dataplus._M_p);
    (*this->includer->_vptr_Includer[2])(this->includer,includedFile);
    std::__cxx11::string::_M_dispose();
  }
  else {
    pIVar1 = this->includer;
    pcVar2 = (this->currentSourceFile)._M_dataplus._M_p;
    sVar7 = std::
            deque<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>
            ::size(&(this->includeStack).c);
    iVar4 = (*pIVar1->_vptr_Includer[1])(pIVar1,_Var3._M_p,pcVar2,sVar7 + 1);
    includedFile = (IncludeResult *)CONCAT44(extraout_var,iVar4);
    if (includedFile == (IncludeResult *)0x0) goto LAB_004331d7;
    if ((includedFile->headerName)._M_string_length == 0) goto LAB_004331da;
LAB_00433233:
    if ((includedFile->headerData == (char *)0x0) || (includedFile->headerLength == 0)) {
      (*this->includer->_vptr_Includer[2])(this->includer,includedFile);
    }
    else {
      uVar6 = (*(this->parseContext->super_TParseVersions)._vptr_TParseVersions[0x39])();
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&prologue);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&epilogue);
      poVar8 = std::operator<<((ostream *)&prologue,"#line ");
      poVar8 = std::ostream::_M_insert<bool>(SUB81(poVar8,0));
      poVar8 = std::operator<<(poVar8," ");
      poVar8 = std::operator<<(poVar8,"\"");
      poVar8 = std::operator<<(poVar8,(string *)includedFile);
      std::operator<<(poVar8,"\"\n");
      pcVar9 = "";
      if (includedFile->headerData[includedFile->headerLength - 1] != '\n') {
        pcVar9 = "\n";
      }
      poVar8 = std::operator<<((ostream *)&epilogue,pcVar9);
      poVar8 = std::operator<<(poVar8,"#line ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(uVar6 & 0xff) + directiveLoc.line);
      poVar8 = std::operator<<(poVar8," ");
      TSourceLoc::getStringNameOrNum_abi_cxx11_(&local_360,&directiveLoc,true);
      poVar8 = std::operator<<(poVar8,(string *)&local_360);
      std::operator<<(poVar8,"\n");
      std::__cxx11::string::_M_dispose();
      this_00 = (TokenizableIncludeFile *)::operator_new(0x118);
      std::__cxx11::stringbuf::str();
      std::__cxx11::stringbuf::str();
      TokenizableIncludeFile::TokenizableIncludeFile
                (this_00,&directiveLoc,&local_360,includedFile,&local_340,this);
      pushInput(this,(tInput *)this_00);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      TIntermediate::addIncludeText
                ((this->parseContext->super_TParseVersions).intermediate,
                 (includedFile->headerName)._M_dataplus._M_p,includedFile->headerData,
                 includedFile->headerLength);
      TParseVersions::setCurrentColumn(&this->parseContext->super_TParseVersions,0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&epilogue);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&prologue);
    }
  }
LAB_004331b9:
  std::__cxx11::string::_M_dispose();
  return iVar5;
}

Assistant:

int TPpContext::CPPinclude(TPpToken* ppToken)
{
    const TSourceLoc directiveLoc = ppToken->loc;
    bool startWithLocalSearch = true; // to additionally include the extra "" paths
    int token;

    // Find the first non-whitespace char after #include
    int ch = getChar();
    while (ch == ' ' || ch == '\t') {
        ch = getChar();
    }
    if (ch == '<') {
        // <header-name> style
        startWithLocalSearch = false;
        token = scanHeaderName(ppToken, '>');
    } else if (ch == '"') {
        // "header-name" style
        token = scanHeaderName(ppToken, '"');
    } else {
        // unexpected, get the full token to generate the error
        ungetChar();
        token = scanToken(ppToken);
    }

    if (token != PpAtomConstString) {
        parseContext.ppError(directiveLoc, "must be followed by a header name", "#include", "");
        return token;
    }

    // Make a copy of the name because it will be overwritten by the next token scan.
    const std::string filename = ppToken->name;

    // See if the directive was well formed
    token = scanToken(ppToken);
    if (token != '\n') {
        if (token == EndOfInput)
            parseContext.ppError(ppToken->loc, "expected newline after header name:", "#include", "%s", filename.c_str());
        else
            parseContext.ppError(ppToken->loc, "extra content after header name:", "#include", "%s", filename.c_str());
        return token;
    }

    // Process well-formed directive

    // Find the inclusion, first look in "Local" ("") paths, if requested,
    // otherwise, only search the "System" (<>) paths.
    TShader::Includer::IncludeResult* res = nullptr;
    if (startWithLocalSearch)
        res = includer.includeLocal(filename.c_str(), currentSourceFile.c_str(), includeStack.size() + 1);
    if (res == nullptr || res->headerName.empty()) {
        includer.releaseInclude(res);
        res = includer.includeSystem(filename.c_str(), currentSourceFile.c_str(), includeStack.size() + 1);
    }

    // Process the results
    if (res != nullptr && !res->headerName.empty()) {
        if (res->headerData != nullptr && res->headerLength > 0) {
            // path for processing one or more tokens from an included header, hand off 'res'
            const bool forNextLine = parseContext.lineDirectiveShouldSetNextLine();
            std::ostringstream prologue;
            std::ostringstream epilogue;
            prologue << "#line " << forNextLine << " " << "\"" << res->headerName << "\"\n";
            epilogue << (res->headerData[res->headerLength - 1] == '\n'? "" : "\n") <<
                "#line " << directiveLoc.line + forNextLine << " " << directiveLoc.getStringNameOrNum() << "\n";
            pushInput(new TokenizableIncludeFile(directiveLoc, prologue.str(), res, epilogue.str(), this));
            parseContext.intermediate.addIncludeText(res->headerName.c_str(), res->headerData, res->headerLength);
            // There's no "current" location anymore.
            parseContext.setCurrentColumn(0);
        } else {
            // things are okay, but there is nothing to process
            includer.releaseInclude(res);
        }
    } else {
        // error path, clean up
        std::string message =
            res != nullptr ? std::string(res->headerData, res->headerLength)
                           : std::string("Could not process include directive");
        parseContext.ppError(directiveLoc, message.c_str(), "#include", "for header name: %s", filename.c_str());
        includer.releaseInclude(res);
    }

    return token;
}